

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O1

mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip,mz_uint32 flags)

{
  uint uVar1;
  mz_zip_internal_state *pmVar2;
  int *piVar3;
  bool bVar4;
  mz_bool mVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int *piVar11;
  uint uVar12;
  uint uVar13;
  mz_uint64 mVar14;
  char cVar15;
  mz_uint32 buf_u32 [1024];
  int local_1038;
  short local_1034;
  short local_1032;
  ushort local_1030;
  ushort local_102e;
  uint local_102c;
  uint local_1028;
  
  uVar10 = pZip->m_archive_size;
  mVar5 = 0;
  if (0x15 < uVar10) {
    mVar14 = 0;
    if (0x1000 < (long)uVar10) {
      mVar14 = uVar10 - 0x1000;
    }
    do {
      uVar10 = pZip->m_archive_size - mVar14;
      sVar7 = 0x1000;
      if (uVar10 < 0x1000) {
        sVar7 = uVar10;
      }
      sVar6 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar14,&local_1038,sVar7);
      cVar15 = '\x01';
      if (sVar6 == sVar7) {
        if (3 < uVar10) {
          uVar13 = (int)sVar7 - 4;
          do {
            if (*(int *)((long)&local_1038 + (ulong)uVar13) == 0x6054b50) {
              cVar15 = '\x02';
              mVar14 = mVar14 + uVar13;
              goto LAB_00132972;
            }
            bVar4 = 0 < (int)uVar13;
            uVar13 = uVar13 - 1;
          } while (bVar4);
        }
        if (mVar14 != 0) {
          cVar15 = 0x10014 < pZip->m_archive_size - mVar14;
          if (!(bool)cVar15) {
            mVar14 = mVar14 - 0xffd;
          }
        }
      }
LAB_00132972:
    } while (cVar15 == '\0');
    if (cVar15 == '\x02') {
      sVar7 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar14,&local_1038,0x16);
      mVar5 = 0;
      if ((sVar7 == 0x16) && (local_1038 == 0x6054b50)) {
        pZip->m_total_files = (uint)local_102e;
        if (((local_102e == local_1030) &&
            (((local_1032 == 0 && local_1034 == 0 || (local_1032 == 1 && local_1034 == 1)) &&
             (uVar10 = (ulong)local_102c, (uint)local_102e * 0x2e <= local_102c)))) &&
           (uVar9 = (ulong)local_1028, uVar9 + uVar10 <= pZip->m_archive_size)) {
          pZip->m_central_directory_file_ofs = uVar9;
          if (local_102e != 0) {
            pmVar2 = pZip->m_pState;
            if (((pmVar2->m_central_dir).m_capacity < uVar10) &&
               (mVar5 = mz_zip_array_ensure_capacity(pZip,&pmVar2->m_central_dir,uVar10,0),
               mVar5 == 0)) {
              return 0;
            }
            (pmVar2->m_central_dir).m_size = uVar10;
            pmVar2 = pZip->m_pState;
            uVar8 = (ulong)pZip->m_total_files;
            if (((pmVar2->m_central_dir_offsets).m_capacity < uVar8) &&
               (mVar5 = mz_zip_array_ensure_capacity(pZip,&pmVar2->m_central_dir_offsets,uVar8,0),
               mVar5 == 0)) {
              return 0;
            }
            (pmVar2->m_central_dir_offsets).m_size = uVar8;
            if ((flags >> 0xb & 1) == 0) {
              pmVar2 = pZip->m_pState;
              uVar8 = (ulong)pZip->m_total_files;
              if (((pmVar2->m_sorted_central_dir_offsets).m_capacity < uVar8) &&
                 (mVar5 = mz_zip_array_ensure_capacity
                                    (pZip,&pmVar2->m_sorted_central_dir_offsets,uVar8,0), mVar5 == 0
                 )) {
                return 0;
              }
              (pmVar2->m_sorted_central_dir_offsets).m_size = uVar8;
            }
            sVar7 = (*pZip->m_pRead)(pZip->m_pIO_opaque,uVar9,(pZip->m_pState->m_central_dir).m_p,
                                     uVar10);
            if (sVar7 != uVar10) {
              return 0;
            }
            if (pZip->m_total_files != 0) {
              pmVar2 = pZip->m_pState;
              piVar3 = (int *)(pmVar2->m_central_dir).m_p;
              uVar9 = 0;
              piVar11 = piVar3;
              do {
                uVar13 = (uint)uVar10;
                if ((uVar13 < 0x2e) || (*piVar11 != 0x2014b50)) {
                  bVar4 = false;
                }
                else {
                  *(int *)((long)(pmVar2->m_central_dir_offsets).m_p + uVar9 * 4) =
                       (int)piVar11 - (int)piVar3;
                  if ((flags >> 0xb & 1) == 0) {
                    *(int *)((long)(pmVar2->m_sorted_central_dir_offsets).m_p + uVar9 * 4) =
                         (int)uVar9;
                  }
                  uVar12 = piVar11[5];
                  uVar1 = piVar11[6];
                  if ((((uVar1 == uVar12 || *(int *)((long)piVar11 + 10) != 0) &&
                       ((uVar12 != 0xffffffff && uVar1 != 0xffffffff) && (uVar12 != 0 || uVar1 == 0)
                       )) && (*(short *)((long)piVar11 + 0x22) == local_1034 ||
                              *(short *)((long)piVar11 + 0x22) == 1)) &&
                     ((ulong)uVar12 + (ulong)*(uint *)((long)piVar11 + 0x2a) + 0x1e <=
                      pZip->m_archive_size)) {
                    uVar12 = (uint)*(ushort *)(piVar11 + 8) +
                             (uint)*(ushort *)((long)piVar11 + 0x1e) +
                             (uint)*(ushort *)(piVar11 + 7) + 0x2e;
                    if (uVar12 <= uVar13) {
                      piVar11 = (int *)((long)piVar11 + (ulong)uVar12);
                      bVar4 = true;
                      uVar10 = (ulong)(uVar13 - uVar12);
                      goto LAB_00132bd3;
                    }
                  }
                  bVar4 = false;
                }
LAB_00132bd3:
                if (!bVar4) {
                  return 0;
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 < pZip->m_total_files);
            }
          }
          mVar5 = 1;
          if ((flags >> 0xb & 1) == 0) {
            mz_zip_reader_sort_central_dir_offsets_by_filename(pZip);
          }
        }
      }
    }
    else {
      mVar5 = 0;
    }
  }
  return mVar5;
}

Assistant:

static mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip, mz_uint32 flags)
{
  mz_uint cdir_size, num_this_disk, cdir_disk_index;
  mz_uint64 cdir_ofs;
  mz_int64 cur_file_ofs;
  const mz_uint8 *p;
  mz_uint32 buf_u32[4096 / sizeof(mz_uint32)]; mz_uint8 *pBuf = (mz_uint8 *)buf_u32;
  mz_bool sort_central_dir = ((flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0);
  // Basic sanity checks - reject files which are too small, and check the first 4 bytes of the file to make sure a local header is there.
  if (pZip->m_archive_size < MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  // Find the end of central directory record by scanning the file from the end towards the beginning.
  cur_file_ofs = MZ_MAX((mz_int64)pZip->m_archive_size - (mz_int64)sizeof(buf_u32), 0);
  for ( ; ; )
  {
    int i, n = (int)MZ_MIN(sizeof(buf_u32), pZip->m_archive_size - cur_file_ofs);
    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf, n) != (mz_uint)n)
      return MZ_FALSE;
    for (i = n - 4; i >= 0; --i)
      if (MZ_READ_LE32(pBuf + i) == MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG)
        break;
    if (i >= 0)
    {
      cur_file_ofs += i;
      break;
    }
    if ((!cur_file_ofs) || ((pZip->m_archive_size - cur_file_ofs) >= (0xFFFF + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)))
      return MZ_FALSE;
    cur_file_ofs = MZ_MAX(cur_file_ofs - (sizeof(buf_u32) - 3), 0);
  }
  // Read and verify the end of central directory record.
  if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) != MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  if ((MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_SIG_OFS) != MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG) ||
      ((pZip->m_total_files = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS)) != MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS)))
    return MZ_FALSE;

  num_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_THIS_DISK_OFS);
  cdir_disk_index = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_DISK_CDIR_OFS);
  if (((num_this_disk | cdir_disk_index) != 0) && ((num_this_disk != 1) || (cdir_disk_index != 1)))
    return MZ_FALSE;

  if ((cdir_size = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_SIZE_OFS)) < pZip->m_total_files * MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)
    return MZ_FALSE;

  cdir_ofs = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_OFS_OFS);
  if ((cdir_ofs + (mz_uint64)cdir_size) > pZip->m_archive_size)
    return MZ_FALSE;

  pZip->m_central_directory_file_ofs = cdir_ofs;

  if (pZip->m_total_files)
  {
     mz_uint i, n;

    // Read the entire central directory into a heap block, and allocate another heap block to hold the unsorted central dir file record offsets, and another to hold the sorted indices.
    if ((!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir, cdir_size, MZ_FALSE)) ||
        (!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir_offsets, pZip->m_total_files, MZ_FALSE)))
      return MZ_FALSE;

    if (sort_central_dir)
    {
      if (!mz_zip_array_resize(pZip, &pZip->m_pState->m_sorted_central_dir_offsets, pZip->m_total_files, MZ_FALSE))
        return MZ_FALSE;
    }

    if (pZip->m_pRead(pZip->m_pIO_opaque, cdir_ofs, pZip->m_pState->m_central_dir.m_p, cdir_size) != cdir_size)
      return MZ_FALSE;

    // Now create an index into the central directory file records, do some basic sanity checking on each record, and check for zip64 entries (which are not yet supported).
    p = (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p;
    for (n = cdir_size, i = 0; i < pZip->m_total_files; ++i)
    {
      mz_uint total_header_size, comp_size, decomp_size, disk_index;
      if ((n < MZ_ZIP_CENTRAL_DIR_HEADER_SIZE) || (MZ_READ_LE32(p) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG))
        return MZ_FALSE;
      MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32, i) = (mz_uint32)(p - (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p);
      if (sort_central_dir)
        MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_sorted_central_dir_offsets, mz_uint32, i) = i;
      comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
      decomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
      if (((!MZ_READ_LE32(p + MZ_ZIP_CDH_METHOD_OFS)) && (decomp_size != comp_size)) || (decomp_size && !comp_size) || (decomp_size == 0xFFFFFFFF) || (comp_size == 0xFFFFFFFF))
        return MZ_FALSE;
      disk_index = MZ_READ_LE16(p + MZ_ZIP_CDH_DISK_START_OFS);
      if ((disk_index != num_this_disk) && (disk_index != 1))
        return MZ_FALSE;
      if (((mz_uint64)MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS) + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + comp_size) > pZip->m_archive_size)
        return MZ_FALSE;
      if ((total_header_size = MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) + MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS) + MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS)) > n)
        return MZ_FALSE;
      n -= total_header_size; p += total_header_size;
    }
  }

  if (sort_central_dir)
    mz_zip_reader_sort_central_dir_offsets_by_filename(pZip);

  return MZ_TRUE;
}